

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashlin.c
# Opt level: O1

void * tommy_hashlin_remove(tommy_hashlin *hashlin,undefined1 *cmp,void *cmp_arg,tommy_hash_t hash)

{
  long lVar1;
  tommy_hashlin_node *ptVar2;
  tommy_hashlin_node *ptVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  tommy_hashlin_node *ptVar7;
  tommy_node_struct *ptVar8;
  void *pvVar9;
  tommy_hashlin_node *ptVar10;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = hashlin->low_mask & hash;
  if (uVar5 < hashlin->split) {
    uVar5 = hashlin->bucket_mask & hash;
  }
  uVar4 = 0x1f;
  if ((uVar5 | 1) != 0) {
    for (; (uVar5 | 1) >> uVar4 == 0; uVar4 = uVar4 - 1) {
    }
  }
  ptVar10 = hashlin->bucket[uVar4][uVar5];
  if (ptVar10 == (tommy_hashlin_node *)0x0) {
    pvVar9 = (void *)0x0;
  }
  else {
    ptVar8 = (tommy_node_struct *)(hashlin->bucket[uVar4] + uVar5);
    pvVar9 = (void *)0x0;
    do {
      if ((ptVar10->key == hash) && (iVar6 = (*(code *)cmp)(cmp_arg,ptVar10->data), iVar6 == 0)) {
        ptVar2 = ptVar8->next;
        ptVar3 = ptVar10->next;
        ptVar7 = ptVar3;
        if (ptVar3 == (tommy_hashlin_node *)0x0) {
          ptVar7 = ptVar2;
        }
        ptVar7->prev = ptVar10->prev;
        if (ptVar2 != ptVar10) {
          ptVar8 = ptVar10->prev;
        }
        ptVar8->next = ptVar3;
        hashlin->count = hashlin->count - 1;
        hashlin_shrink_step(hashlin);
        pvVar9 = ptVar10->data;
        break;
      }
      ptVar10 = ptVar10->next;
    } while (ptVar10 != (tommy_node_struct *)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return pvVar9;
}

Assistant:

void* tommy_hashlin_remove(tommy_hashlin* hashlin, tommy_search_func* cmp, const void* cmp_arg, tommy_hash_t hash)
{
	tommy_hashlin_node** let_ptr = tommy_hashlin_bucket_ref(hashlin, hash);
	tommy_hashlin_node* node = *let_ptr;

	while (node) {
		/* we first check if the hash matches, as in the same bucket we may have multiples hash values */
		if (node->key == hash && cmp(cmp_arg, node->data) == 0) {
			tommy_list_remove_existing(let_ptr, node);

			--hashlin->count;

			hashlin_shrink_step(hashlin);

			return node->data;
		}
		node = node->next;
	}

	return 0;
}